

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O0

void set_look_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *pvVar3;
  Am_Widget_Look local_30 [4];
  undefined1 local_20 [8];
  Am_Value my_look;
  Am_Object *cmd_local;
  
  my_look.value = (anon_union_8_8_ea4c8939_for_value)cmd;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x17f);
  Am_Value::Am_Value((Am_Value *)local_20,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Setting look to ");
  pvVar3 = (void *)operator<<(poVar2,(Am_Value *)local_20);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  Am_Widget_Look::Am_Widget_Look(local_30,(Am_Value *)local_20);
  Am_Set_Default_Look((Am_Widget_Look *)(ulong)local_30[0].value);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_look, (Am_Object cmd))
{
  Am_Value my_look = cmd.Get(Am_WIDGET_LOOK);
  std::cout << "Setting look to " << my_look << std::endl << std::flush;
  Am_Set_Default_Look(my_look);
}